

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlNodeDumpFileFormat(FILE *out,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlCharEncoding xVar1;
  int iVar2;
  xmlCharEncodingHandlerPtr encoder;
  xmlOutputBufferPtr buf;
  
  xmlInitParser();
  if (encoding == (char *)0x0) {
    encoder = xmlFindCharEncodingHandler("HTML");
    if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
      encoder = xmlFindCharEncodingHandler("ascii");
    }
  }
  else {
    xVar1 = xmlParseCharEncoding(encoding);
    if (xVar1 == XML_CHAR_ENCODING_UTF8) {
      encoder = (xmlCharEncodingHandlerPtr)0x0;
    }
    else {
      encoder = xmlFindCharEncodingHandler(encoding);
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        encoder = (xmlCharEncodingHandlerPtr)0x0;
        __xmlSimpleError(7,0x57b,(xmlNodePtr)0x0,"unknown encoding %s\n",encoding);
      }
    }
  }
  buf = xmlOutputBufferCreateFile(out,encoder);
  if (buf == (xmlOutputBufferPtr)0x0) {
    return 0;
  }
  htmlNodeDumpFormatOutput(buf,doc,cur,(char *)0x0,format);
  iVar2 = xmlOutputBufferClose(buf);
  return iVar2;
}

Assistant:

int
htmlNodeDumpFileFormat(FILE *out, xmlDocPtr doc,
	               xmlNodePtr cur, const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    xmlInitParser();

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFile(out, handler);
    if (buf == NULL) return(0);

    htmlNodeDumpFormatOutput(buf, doc, cur, NULL, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}